

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_color_spray(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int *piVar2;
  char *in_RCX;
  undefined8 in_RDX;
  undefined4 in_EDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  CHAR_DATA *in_stack_00000008;
  int dam;
  CHAR_DATA *victim;
  int in_stack_0000004c;
  void *in_stack_00000050;
  CHAR_DATA *in_stack_00000058;
  int in_stack_00000060;
  int in_stack_00000064;
  int to;
  int from;
  char *pcVar3;
  int iVar4;
  
  from = 0x32;
  pcVar3 = in_RCX;
  std::min<int>((int *)&stack0xfffffffffffffff8,(int *)&stack0xffffffffffffffd0);
  to = 0;
  piVar2 = std::max<int>((int *)&stack0xffffffffffffffcc,(int *)&stack0xfffffffffffffff8);
  iVar4 = *piVar2;
  number_range(from,to);
  bVar1 = saves_spell((int)victim,in_stack_00000008,unaff_retaddr_00);
  if (!bVar1) {
    skill_lookup(in_RCX);
    spell_blindness(in_stack_00000064,in_stack_00000060,in_stack_00000058,in_stack_00000050,
                    in_stack_0000004c);
  }
  damage_old((CHAR_DATA *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             (CHAR_DATA *)CONCAT44(in_EDI,iVar4),(int)((ulong)in_RDX >> 0x20),(int)in_RDX,
             (int)((ulong)pcVar3 >> 0x20),SUB81((ulong)pcVar3 >> 0x18,0));
  return;
}

Assistant:

void spell_color_spray(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	static const short dam_each[] =
	{
		0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  0,  30, 35, 40, 45, 50, 55,
		55, 55, 56, 57, 58, 58, 59, 60, 61, 61, 62, 63, 64, 64, 65, 66, 67,
		67, 68, 69, 70, 70, 71, 72, 73, 73, 74, 75, 76, 76, 77, 78, 79, 79
	}
	;
	int dam;

	level = std::min(level, (int)sizeof(dam_each) / (int)sizeof(dam_each[0]) - 1);
	level = std::max(0, level);

	dam = number_range(dam_each[level] / 2, dam_each[level] * 2);

	if (saves_spell(level, victim, DAM_LIGHT))
		dam /= 2;
	else
		spell_blindness(skill_lookup("blindness"), level / 2, ch, (void *)victim, TARGET_CHAR);

	damage_old(ch, victim, dam, sn, DAM_LIGHT, true);
}